

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcValue.cpp
# Opt level: O2

void __thiscall XmlRpc::XmlRpcValue::invalidate(XmlRpcValue *this)

{
  tm *this_00;
  ulong uStack_20;
  
  switch(this->_type) {
  case TypeString:
    this_00 = (this->_value).asTime;
    if (this_00 != (tm *)0x0) {
      std::__cxx11::string::~string((string *)this_00);
    }
    uStack_20 = 0x20;
    break;
  case TypeDateTime:
    this_00 = (this->_value).asTime;
    uStack_20 = 0x38;
    break;
  case TypeBase64:
    this_00 = (this->_value).asTime;
    if (this_00 != (tm *)0x0) {
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                ((_Vector_base<char,_std::allocator<char>_> *)this_00);
    }
    goto LAB_002889a3;
  case TypeArray:
    this_00 = (this->_value).asTime;
    if (this_00 != (tm *)0x0) {
      std::vector<XmlRpc::XmlRpcValue,_std::allocator<XmlRpc::XmlRpcValue>_>::~vector
                ((vector<XmlRpc::XmlRpcValue,_std::allocator<XmlRpc::XmlRpcValue>_> *)this_00);
    }
LAB_002889a3:
    uStack_20 = 0x18;
    break;
  case TypeStruct:
    this_00 = (this->_value).asTime;
    if (this_00 != (tm *)0x0) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>_>
                   *)this_00);
    }
    uStack_20 = 0x30;
    break;
  default:
    goto switchD_00288953_default;
  }
  operator_delete(this_00,uStack_20);
switchD_00288953_default:
  this->_type = TypeInvalid;
  (this->_value).asDouble = 0.0;
  return;
}

Assistant:

void XmlRpcValue::invalidate()
  {
    switch (_type) {
      case TypeString:    delete _value.asString; break;
      case TypeDateTime:  delete _value.asTime;   break;
      case TypeBase64:    delete _value.asBinary; break;
      case TypeArray:     delete _value.asArray;  break;
      case TypeStruct:    delete _value.asStruct; break;
      default: break;
    }
    _type = TypeInvalid;
    _value.asBinary = 0;
  }